

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

bool __thiscall Js::BigUInt::FAdd(BigUInt *this,BigUInt *pbi)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint32 lu2;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x158,"(pbi)","pbi");
    if (!bVar3) goto LAB_00697dce;
    *puVar6 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x159,"(this != pbi)","this != pbi");
    if (!bVar3) {
LAB_00697dce:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar7 = this->m_clu;
  uVar11 = pbi->m_clu;
  uVar8 = uVar11;
  if ((((int)uVar11 <= (int)uVar7) || (uVar8 = uVar7, uVar7 = uVar11, (int)uVar11 <= this->m_cluMax)
      ) || (bVar3 = FResize(this,uVar11 + 1), bVar3)) {
    if ((int)uVar8 < 1) {
      uVar11 = 0;
      lu2 = 0;
    }
    else {
      uVar11 = 0;
      lVar9 = 0;
      lu2 = 0;
      do {
        iVar4 = 0;
        if (lu2 != 0) {
          iVar4 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar9),lu2);
        }
        iVar5 = NumberUtilities::AddLu
                          ((uint32 *)((long)this->m_prglu + lVar9),
                           *(uint32 *)((long)pbi->m_prglu + lVar9));
        lu2 = iVar5 + iVar4;
        lVar9 = lVar9 + 4;
        uVar11 = uVar11 + 1;
      } while ((ulong)uVar8 << 2 != lVar9);
    }
    if (this->m_clu < pbi->m_clu) {
      if ((int)uVar11 < (int)uVar7) {
        lVar12 = (long)(int)uVar7 - (ulong)uVar11;
        lVar9 = (ulong)uVar11 << 2;
        do {
          puVar1 = this->m_prglu;
          *(undefined4 *)((long)puVar1 + lVar9) = *(undefined4 *)((long)pbi->m_prglu + lVar9);
          if (lu2 == 0) {
            lu2 = 0;
          }
          else {
            lu2 = NumberUtilities::AddLu((uint32 *)((long)puVar1 + lVar9),lu2);
          }
          lVar9 = lVar9 + 4;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      this->m_clu = uVar7;
    }
    else if ((lu2 != 0) && ((int)uVar11 < (int)uVar7)) {
      uVar10 = (ulong)uVar11;
      lVar9 = uVar10 * 4;
      do {
        uVar10 = uVar10 + 1;
        lu2 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar9),lu2);
        if (lu2 == 0) break;
        lVar9 = lVar9 + 4;
      } while ((long)uVar10 < (long)(int)uVar7);
    }
    if (lu2 != 0) {
      if ((this->m_cluMax <= this->m_clu) && (bVar3 = FResize(this,this->m_clu + 1), !bVar3))
      goto LAB_00697dbd;
      iVar4 = this->m_clu;
      this->m_clu = iVar4 + 1;
      this->m_prglu[iVar4] = lu2;
    }
    AssertValid(this,true);
    bVar3 = true;
  }
  else {
LAB_00697dbd:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BigUInt::FAdd(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 cluMax, cluMin;
        int32 ilu;
        int wCarry;

        if ((cluMax = m_clu) < (cluMin = pbi->m_clu))
        {
            cluMax = pbi->m_clu;
            cluMin = m_clu;
            if (cluMax > m_cluMax && !FResize(cluMax + 1))
                return false;
        }

        wCarry = 0;
        for (ilu = 0; ilu < cluMin; ilu++)
        {
            if (0 != wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            wCarry += NumberUtilities::AddLu(&m_prglu[ilu], pbi->m_prglu[ilu]);
        }

        if (m_clu < pbi->m_clu)
        {
            for (; ilu < cluMax; ilu++)
            {
                m_prglu[ilu] = pbi->m_prglu[ilu];
                if (0 != wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            }
            m_clu = cluMax;
        }
        else
        {
            for (; 0 != wCarry && ilu < cluMax; ilu++)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
        }

        if (0 != wCarry)
        {
            if (m_clu >= m_cluMax && !FResize(m_clu + 1))
                return false;
            m_prglu[m_clu++] = wCarry;
        }

        AssertBi(this);
        return true;
    }